

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
dgrminer::find_minimum_labelings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges,
          bool ignore_starting_edges)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference this;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type local_a4;
  value_type local_a0;
  int local_9c;
  byte local_95;
  int k_1;
  bool is_same_as_min;
  value_type local_84;
  int local_80;
  byte local_79;
  int k;
  bool is_same;
  size_t j;
  value_type vStack_68;
  bool is_in_starting;
  size_t i;
  undefined1 auStack_58 [8];
  array<int,_10UL> min_edge;
  bool ignore_starting_edges_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list_local;
  vector<int,_std::allocator<int>_> *min_ind;
  
  i._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  _vStack_68 = 0;
  do {
    uVar2 = _vStack_68;
    sVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      (pattern_edge_list);
    if (sVar3 <= uVar2) {
      return __return_storage_ptr__;
    }
    j._7_1_ = 0;
    if (ignore_starting_edges) {
      j._7_1_ = 1;
    }
    else {
      for (_k = 0; uVar2 = _k,
          sVar3 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                            (starting_edges), uVar2 < sVar3; _k = _k + 1) {
        local_79 = 1;
        for (local_80 = 0; local_80 < 7; local_80 = local_80 + 1) {
          pvVar5 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                   operator[](pattern_edge_list,_vStack_68);
          pvVar6 = std::array<int,_10UL>::operator[](pvVar5,(long)(local_80 + 2));
          iVar1 = *pvVar6;
          this = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                 operator[](starting_edges,_k);
          pvVar4 = std::array<int,_8UL>::operator[](this,(long)local_80);
          if (iVar1 != *pvVar4) {
            local_79 = 0;
            break;
          }
        }
        if ((local_79 & 1) != 0) {
          j._7_1_ = 1;
          break;
        }
      }
    }
    if ((j._7_1_ & 1) != 0) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
      if (sVar3 == 0) {
        local_84 = vStack_68;
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_84);
        pvVar5 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                 operator[](pattern_edge_list,_vStack_68);
        memcpy(auStack_58,pvVar5,0x28);
      }
      else {
        local_95 = 1;
        for (local_9c = 2; local_9c < 9; local_9c = local_9c + 1) {
          pvVar5 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                   operator[](pattern_edge_list,_vStack_68);
          pvVar6 = std::array<int,_10UL>::operator[](pvVar5,(long)local_9c);
          iVar1 = *pvVar6;
          pvVar6 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)auStack_58,(long)local_9c);
          if (iVar1 < *pvVar6) {
            pvVar5 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                     operator[](pattern_edge_list,_vStack_68);
            min_edge._M_elems._24_8_ = *(undefined8 *)(pvVar5->_M_elems + 8);
            auStack_58 = *(undefined1 (*) [8])pvVar5->_M_elems;
            min_edge._M_elems._0_8_ = *(undefined8 *)(pvVar5->_M_elems + 2);
            min_edge._M_elems._8_8_ = *(undefined8 *)(pvVar5->_M_elems + 4);
            min_edge._M_elems._16_8_ = *(undefined8 *)(pvVar5->_M_elems + 6);
            std::vector<int,_std::allocator<int>_>::clear(__return_storage_ptr__);
            local_a0 = vStack_68;
            std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_a0);
            local_95 = 0;
            break;
          }
          pvVar5 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                   operator[](pattern_edge_list,_vStack_68);
          pvVar6 = std::array<int,_10UL>::operator[](pvVar5,(long)local_9c);
          iVar1 = *pvVar6;
          pvVar6 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)auStack_58,(long)local_9c);
          if (*pvVar6 < iVar1) {
            local_95 = 0;
            break;
          }
        }
        if ((local_95 & 1) != 0) {
          local_a4 = vStack_68;
          std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_a4);
        }
      }
    }
    _vStack_68 = _vStack_68 + 1;
  } while( true );
}

Assistant:

std::vector<int> find_minimum_labelings(std::vector<std::array<int, 10>> &pattern_edge_list,
                                            std::vector<std::array<int, 8>> &starting_edges,
                                            bool ignore_starting_edges)
    {
        std::array<int, 10> min_edge;
        std::vector<int> min_ind; // can contain several indices, if there are several same edges (probably not necessary to have vector, because it may be impossible to have several of them when using edge IDs)
        for (size_t i = 0; i < pattern_edge_list.size(); i++)
        {
            // check if the i-th edge is in the starting_edges list:
            bool is_in_starting = false;

            if (ignore_starting_edges)
            {
                is_in_starting = true;
            }
            else
            {
                for (size_t j = 0; j < starting_edges.size(); j++)
                {
                    bool is_same = true;

                    // use only the first 7 elements (DO NOT USE edge id)
                    for (int k = 0; k < 7; k++)
                    {
                        if (pattern_edge_list[i][k + 2] != starting_edges[j][k])
                        {
                            is_same = false;
                            break;
                        }
                    }
                    if (is_same)
                    {
                        is_in_starting = true;
                        break;
                    }

                }
            }

            // if it is in the starting_edges list, then
            if (is_in_starting)
            {
                // if it is the first edge, add it
                if (min_ind.size() == 0)
                {
                    min_ind.push_back(i);
                    min_edge = pattern_edge_list[i];
                }
                    // if it is not the first one, check if it is smaller
                else
                {
                    // check also whether it is same as the smallest one
                    bool is_same_as_min = true;
                    // // check also edge ID (10th element)
                    // do not check ID
                    for (int k = 2; k < 9; k++)
                    {
                        if (pattern_edge_list[i][k] < min_edge[k])
                        {
                            min_edge = pattern_edge_list[i];
                            min_ind.clear();
                            min_ind.push_back(i);
                            is_same_as_min = false;
                            break;
                        }
                        else if (pattern_edge_list[i][k] > min_edge[k])
                        {
                            is_same_as_min = false;
                            break;
                        }
                    }
                    if (is_same_as_min)
                    {
                        min_ind.push_back(i);
                    }
                }
            }


        }

        return min_ind;

    }